

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_handler_alloc_file(nng_http_handler **hp,char *uri,char *path)

{
  nng_err nVar1;
  char *path_local;
  char *uri_local;
  nng_http_handler **hp_local;
  
  nVar1 = nni_http_handler_init_file(hp,uri,path);
  return nVar1;
}

Assistant:

nng_err
nng_http_handler_alloc_file(
    nng_http_handler **hp, const char *uri, const char *path)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_handler_init_file(hp, uri, path));
#else
	NNI_ARG_UNUSED(hp);
	NNI_ARG_UNUSED(uri);
	NNI_ARG_UNUSED(path);
	return (NNG_ENOTSUP);
#endif
}